

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O0

void __thiscall
amrex::StateData::FillBoundary
          (StateData *this,FArrayBox *dest,Real time,Real *dx,RealBox *prob_domain,int dest_comp,
          int src_comp,int num_comp)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pBVar3;
  pointer pBVar4;
  bool bVar5;
  int iVar6;
  Box *b;
  Real *pRVar7;
  double *pdVar8;
  BndryFunc *pBVar9;
  RealBox *in_RCX;
  pointer in_RDX;
  BaseFab<double> *in_RSI;
  long in_RDI;
  int in_stack_00000008;
  int k;
  int *bc;
  int j;
  int *bci;
  int groupsize;
  Real *dat;
  int sc;
  int dc;
  int i_1;
  int i;
  Real *problo;
  BCRec bcr;
  Real xlo [3];
  Vector<int,_std::allocator<int>_> bcrs;
  int *phi;
  int *plo;
  int *dhi;
  int *dlo;
  Box *bx;
  int dir_2;
  int *dhi_3;
  int *dlo_3;
  int *bxhi_2;
  int *bxlo_2;
  int dir_1;
  int *dhi_2;
  int *dlo_2;
  int *bxhi_1;
  int *bxlo_1;
  int dir;
  int *dhi_1;
  int *dlo_1;
  int *bxhi;
  int *bxlo;
  pointer in_stack_fffffffffffffc28;
  int iVar10;
  StateDescriptor *in_stack_fffffffffffffc30;
  BCRec *in_stack_fffffffffffffc40;
  int in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc4c;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffc50;
  int local_3a4;
  int local_394;
  int local_36c;
  int local_35c;
  int local_2fc;
  int local_2ec;
  int local_2b4;
  int local_2a4;
  int *local_2a0;
  int local_270;
  int local_26c;
  BCRec local_260;
  StateDescriptor local_248;
  int *local_160;
  int *local_158;
  BCRec *local_150;
  BCRec *local_148;
  Box *local_140;
  Box *local_138;
  int local_12c;
  int *local_128;
  int *local_120;
  int *local_118;
  int *local_110;
  BCRec *local_108;
  BCRec *local_100;
  Box *local_f8;
  Box *local_f0;
  BCRec *local_e8;
  BCRec *local_e0;
  BCRec *local_d8;
  int local_d0;
  int local_cc;
  BCRec *local_c8;
  int local_c0;
  int local_bc;
  BCRec *local_b8;
  int local_b0;
  int local_ac;
  BCRec *local_a8;
  int local_9c;
  BCRec *local_98;
  int local_8c;
  BCRec *local_88;
  int local_7c;
  BCRec *local_78;
  int local_70;
  int local_6c;
  BCRec *local_68;
  int local_60;
  int local_5c;
  BCRec *local_58;
  int local_50;
  int local_4c;
  BCRec *local_48;
  int local_3c;
  BCRec *local_38;
  int local_2c;
  BCRec *local_28;
  int local_1c;
  BCRec *local_18;
  
  local_248.bc_func.
  super_vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
  .
  super__Vector_base<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_RCX;
  local_248.bc_func.
  super_vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
  .
  super__Vector_base<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_RDX;
  local_248.m_primary.super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)in_RSI;
  b = BaseFab<double>::box(in_RSI);
  bVar5 = Box::contains((Box *)(in_RDI + 0x10),b);
  if (!bVar5) {
    local_248.bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)BaseFab<double>::box
                            ((BaseFab<double> *)
                             local_248.m_primary.super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish);
    local_248.bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)BaseFab<double>::loVect((BaseFab<double> *)0x11164ff);
    local_248.bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)BaseFab<double>::hiVect((BaseFab<double> *)0x1116514);
    local_248.names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)Box::loVect((Box *)(in_RDI + 0x10));
    local_248.names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)Box::hiVect((Box *)(in_RDI + 0x10));
    Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x111655b);
    BCRec::BCRec(&local_260);
    pRVar7 = RealBox::lo((RealBox *)
                         local_248.bc_func.
                         super_vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
                         .
                         super__Vector_base<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    for (local_26c = 0; local_26c < 3; local_26c = local_26c + 1) {
      *(double *)(&local_248.type + (long)local_26c * 2) =
           (double)local_248.bc_func.
                   super_vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage[local_26c]._M_t.
                   super___uniq_ptr_impl<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_amrex::StateDescriptor::BndryFunc_*,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
                   .super__Head_base<0UL,_amrex::StateDescriptor::BndryFunc_*,_false>._M_head_impl *
           (double)((local_248.bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                     super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                     super__Vector_impl_data._M_finish)->bc[local_26c] -
                   *(int *)(&(local_248.names.
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus +
                           (long)local_26c * 4)) + pRVar7[local_26c];
    }
    local_270 = 0;
    while (local_270 < in_stack_00000008) {
      pdVar8 = BaseFab<double>::dataPtr
                         ((BaseFab<double> *)
                          CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                          (int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
      bVar5 = StateDescriptor::primary
                        (in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20));
      pBVar3 = local_248.bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
               super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      iVar6 = (int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
      if (bVar5) {
        iVar6 = StateDescriptor::groupsize(in_stack_fffffffffffffc30,iVar6);
        pBVar3 = local_248.bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                 super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        iVar10 = (int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
        if (in_stack_00000008 < iVar6 + local_270) {
          local_148 = StateDescriptor::getBC(in_stack_fffffffffffffc30,iVar10);
          local_138 = (Box *)pBVar3;
          local_150 = &local_260;
          local_140 = (Box *)(in_RDI + 0x10);
          local_158 = Box::loVect((Box *)pBVar3);
          local_160 = Box::hiVect(local_138);
          local_248.min_map_end_comp.super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = Box::loVect(local_140);
          local_248.min_map_end_comp.super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
               Box::hiVect(local_140);
          for (local_248.min_map_end_comp.super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start._4_4_ = 0;
              local_248.min_map_end_comp.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              ._4_4_ < 3;
              local_248.min_map_end_comp.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              ._4_4_ = local_248.min_map_end_comp.super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start._4_4_ + 1) {
            if (local_248.min_map_end_comp.super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage
                [local_248.min_map_end_comp.super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start._4_4_] <
                local_158[local_248.min_map_end_comp.super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_]) {
              local_35c = 0;
            }
            else {
              local_88 = local_148;
              local_8c = local_248.min_map_end_comp.super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_;
              local_35c = local_148->bc
                          [local_248.min_map_end_comp.super_vector<int,_std::allocator<int>_>.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_];
            }
            local_bc = local_248.min_map_end_comp.super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start._4_4_;
            local_b8 = local_150;
            local_c0 = local_35c;
            local_150->bc
            [local_248.min_map_end_comp.super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
             _4_4_] = local_35c;
            if (local_160[local_248.min_map_end_comp.super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_] <
                local_248.min_map_end_comp.super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish[local_248.min_map_end_comp.super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_]) {
              local_36c = 0;
            }
            else {
              local_28 = local_148;
              local_2c = local_248.min_map_end_comp.super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_;
              local_36c = local_148->bc
                          [local_248.min_map_end_comp.super_vector<int,_std::allocator<int>_>.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_ + 3];
            }
            local_5c = local_248.min_map_end_comp.super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start._4_4_;
            local_58 = local_150;
            local_60 = local_36c;
            local_150->bc
            [local_248.min_map_end_comp.super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
             _4_4_ + 3] = local_36c;
          }
          pBVar9 = StateDescriptor::bndryFill(in_stack_fffffffffffffc30,iVar10);
          in_stack_fffffffffffffc40 = &local_260;
          in_stack_fffffffffffffc30 = &local_248;
          in_stack_fffffffffffffc28 =
               local_248.bc_func.
               super_vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_e0 = in_stack_fffffffffffffc40;
          (*pBVar9->_vptr_BndryFunc[3])
                    (pBVar9,pdVar8,
                     local_248.bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                     super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     local_248.bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                     super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_248.names.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     local_248.names.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     local_248.bc_func.
                     super_vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,in_stack_fffffffffffffc30,
                     &local_248.m_primary);
          local_270 = local_270 + 1;
        }
        else {
          std::vector<int,_std::allocator<int>_>::resize
                    (in_stack_fffffffffffffc50,
                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          local_2a0 = Vector<int,_std::allocator<int>_>::dataPtr
                                ((Vector<int,_std::allocator<int>_> *)0x1116709);
          for (local_2a4 = 0;
              pBVar3 = local_248.bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                       super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
              iVar10 = (int)((ulong)in_stack_fffffffffffffc28 >> 0x20), local_2a4 < iVar6;
              local_2a4 = local_2a4 + 1) {
            local_100 = StateDescriptor::getBC(in_stack_fffffffffffffc30,iVar10);
            local_f0 = (Box *)pBVar3;
            local_108 = &local_260;
            local_f8 = (Box *)(in_RDI + 0x10);
            local_110 = Box::loVect((Box *)pBVar3);
            local_118 = Box::hiVect(local_f0);
            local_120 = Box::loVect(local_f8);
            local_128 = Box::hiVect(local_f8);
            for (local_12c = 0; local_12c < 3; local_12c = local_12c + 1) {
              if (local_120[local_12c] < local_110[local_12c]) {
                local_2ec = 0;
              }
              else {
                local_98 = local_100;
                local_9c = local_12c;
                local_2ec = local_100->bc[local_12c];
              }
              local_cc = local_12c;
              local_c8 = local_108;
              local_d0 = local_2ec;
              local_108->bc[local_12c] = local_2ec;
              if (local_118[local_12c] < local_128[local_12c]) {
                local_2fc = 0;
              }
              else {
                local_38 = local_100;
                local_3c = local_12c;
                local_2fc = local_100->bc[local_12c + 3];
              }
              local_6c = local_12c;
              local_68 = local_108;
              local_70 = local_2fc;
              local_108->bc[local_12c + 3] = local_2fc;
            }
            local_d8 = &local_260;
            for (local_2b4 = 0; local_2b4 < 6; local_2b4 = local_2b4 + 1) {
              local_2a0[local_2b4] = local_d8->bc[local_2b4];
            }
            local_2a0 = local_2a0 + 6;
          }
          pBVar9 = StateDescriptor::bndryFill(in_stack_fffffffffffffc30,iVar10);
          in_stack_fffffffffffffc28 =
               local_248.bc_func.
               super_vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pBVar4 = local_248.bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                   super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pBVar3 = local_248.bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                   super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pbVar2 = local_248.names.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pbVar1 = local_248.names.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          in_stack_fffffffffffffc40 =
               (BCRec *)Vector<int,_std::allocator<int>_>::dataPtr
                                  ((Vector<int,_std::allocator<int>_> *)0x1116b20);
          in_stack_fffffffffffffc30 = &local_248;
          in_stack_fffffffffffffc48 = iVar6;
          (*pBVar9->_vptr_BndryFunc[4])
                    (pBVar9,pdVar8,pBVar4,pBVar3,pbVar2,pbVar1,in_stack_fffffffffffffc28,
                     in_stack_fffffffffffffc30,&local_248.m_primary);
          local_270 = iVar6 + local_270;
        }
      }
      else {
        local_248.max_map_start_comp.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             StateDescriptor::getBC(in_stack_fffffffffffffc30,iVar6)->bc;
        local_248.max_map_start_comp.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pBVar3->bc;
        local_248.mapper_comp.
        super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
        super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&local_260;
        local_248.max_map_start_comp.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             (pointer)(in_RDI + 0x10);
        local_248.mapper_comp.
        super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
        super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)Box::loVect((Box *)pBVar3);
        local_248.mapper_comp.
        super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
        super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)Box::hiVect((Box *)local_248.max_map_start_comp.
                                         super_vector<int,_std::allocator<int>_>.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_end_of_storage);
        local_248.m_groupsize.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             Box::loVect((Box *)local_248.max_map_start_comp.super_vector<int,_std::allocator<int>_>
                                .super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish);
        local_248.m_groupsize.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             Box::hiVect((Box *)local_248.max_map_start_comp.super_vector<int,_std::allocator<int>_>
                                .super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish);
        for (local_248.m_groupsize.super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
             _4_4_ = 0;
            local_248.m_groupsize.super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
            _4_4_ < 3;
            local_248.m_groupsize.super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
            _4_4_ = local_248.m_groupsize.super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start._4_4_ + 1) {
          if (local_248.m_groupsize.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage
              [local_248.m_groupsize.super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start._4_4_] <
              *(int *)((long)local_248.mapper_comp.
                             super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>
                             .
                             super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish +
                      (long)local_248.m_groupsize.super_vector<int,_std::allocator<int>_>.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_ * 4)) {
            local_394 = 0;
          }
          else {
            local_78 = (BCRec *)local_248.max_map_start_comp.super_vector<int,_std::allocator<int>_>
                                .super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
            local_7c = local_248.m_groupsize.super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start._4_4_;
            local_394 = local_248.max_map_start_comp.super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [local_248.m_groupsize.super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_];
          }
          local_ac = local_248.m_groupsize.super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start._4_4_;
          local_a8 = (BCRec *)local_248.mapper_comp.
                              super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>
                              .
                              super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_b0 = local_394;
          ((int *)local_248.mapper_comp.
                  super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
                  super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage)
          [local_248.m_groupsize.super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
           _4_4_] = local_394;
          if (*(int *)((long)local_248.mapper_comp.
                             super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>
                             .
                             super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                      (long)local_248.m_groupsize.super_vector<int,_std::allocator<int>_>.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_ * 4) <
              local_248.m_groupsize.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish[local_248.m_groupsize.super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_]) {
            local_3a4 = 0;
          }
          else {
            local_18 = (BCRec *)local_248.max_map_start_comp.super_vector<int,_std::allocator<int>_>
                                .super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
            local_1c = local_248.m_groupsize.super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start._4_4_;
            local_3a4 = local_248.max_map_start_comp.super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [local_248.m_groupsize.super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_ + 3];
          }
          local_4c = local_248.m_groupsize.super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start._4_4_;
          local_48 = (BCRec *)local_248.mapper_comp.
                              super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>
                              .
                              super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_50 = local_3a4;
          ((int *)local_248.mapper_comp.
                  super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
                  super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage)
          [local_248.m_groupsize.super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
           _4_4_ + 3] = local_3a4;
        }
        pBVar9 = StateDescriptor::bndryFill(in_stack_fffffffffffffc30,iVar6);
        in_stack_fffffffffffffc40 = &local_260;
        in_stack_fffffffffffffc30 = &local_248;
        in_stack_fffffffffffffc28 =
             local_248.bc_func.
             super_vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_e8 = in_stack_fffffffffffffc40;
        (*pBVar9->_vptr_BndryFunc[3])
                  (pBVar9,pdVar8,
                   local_248.bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                   super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   local_248.bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                   super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_248.names.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   local_248.names.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   local_248.bc_func.
                   super_vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,in_stack_fffffffffffffc30,
                   &local_248.m_primary);
        local_270 = local_270 + 1;
      }
    }
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x11171ee);
  }
  return;
}

Assistant:

void
StateData::FillBoundary (FArrayBox&     dest,
                         Real           time,
                         const Real*    dx,
                         const RealBox& prob_domain,
                         int            dest_comp,
                         int            src_comp,
                         int            num_comp)
{
    BL_PROFILE("StateData::FillBoundary(dx)");
    BL_ASSERT(dest.box().ixType() == desc->getType());

    if (domain.contains(dest.box())) return;

    const Box& bx  = dest.box();
    const int* dlo = dest.loVect();
    const int* dhi = dest.hiVect();
    const int* plo = domain.loVect();
    const int* phi = domain.hiVect();

    Vector<int> bcrs;

    Real xlo[AMREX_SPACEDIM];
    BCRec bcr;
    const Real* problo = prob_domain.lo();

    for (int i = 0; i < AMREX_SPACEDIM; i++)
    {
        xlo[i] = problo[i] + dx[i]*(dlo[i]-plo[i]);
    }
    for (int i = 0; i < num_comp; )
    {
        const int dc  = dest_comp+i;
        const int sc  = src_comp+i;
        Real*     dat = dest.dataPtr(dc);

        if (desc->primary(sc))
        {
            const int groupsize = desc->groupsize(sc);

            BL_ASSERT(groupsize != 0);

            if (groupsize+i <= num_comp)
            {
                //
                // Can do the whole group at once.
                //
                bcrs.resize(2*AMREX_SPACEDIM*groupsize);

                int* bci  = bcrs.dataPtr();

                for (int j = 0; j < groupsize; j++)
                {
                    amrex::setBC(bx,domain,desc->getBC(sc+j),bcr);

                    const int* bc = bcr.vect();

                    for (int k = 0; k < 2*AMREX_SPACEDIM; k++)
                        bci[k] = bc[k];

                    bci += 2*AMREX_SPACEDIM;
                }
                //
                // Use the "group" boundary fill routine.
                //
                desc->bndryFill(sc)(dat,dlo,dhi,plo,phi,dx,xlo,&time,bcrs.dataPtr(),groupsize);
                i += groupsize;
            }
            else
            {
                amrex::setBC(bx,domain,desc->getBC(sc),bcr);
                desc->bndryFill(sc)(dat,dlo,dhi,plo,phi,dx,xlo,&time,bcr.vect());
                i++;
            }
        }
        else
        {
            amrex::setBC(bx,domain,desc->getBC(sc),bcr);
            desc->bndryFill(sc)(dat,dlo,dhi,plo,phi,dx,xlo,&time,bcr.vect());
            i++;
        }
    }

#ifdef AMREX_USE_GPU
    // Add a streamSynchronize here in case the user code launched kernels
    // to handle the boundary fills.
    Gpu::streamSynchronize();
#endif
}